

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O1

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::StreamQueryResult::FetchRaw(StreamQueryResult *this)

{
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var1;
  DataChunk *pDVar2;
  type lock_00;
  pointer pDVar3;
  StreamQueryResult *in_RSI;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_30;
  undefined1 local_28 [8];
  DataChunk *local_20;
  
  local_30._M_head_impl = (DataChunk *)0x0;
  LockContext((StreamQueryResult *)local_28);
  lock_00 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
            ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                         *)local_28);
  CheckExecutableInternal(in_RSI,lock_00);
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
  operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
             *)local_28);
  FetchInternal((StreamQueryResult *)&stack0xffffffffffffffe0,(ClientContextLock *)in_RSI);
  pDVar2 = local_20;
  _Var1._M_head_impl = local_30._M_head_impl;
  local_20 = (DataChunk *)0x0;
  local_30._M_head_impl = pDVar2;
  if (_Var1._M_head_impl != (DataChunk *)0x0) {
    DataChunk::~DataChunk(_Var1._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
               *)local_28);
  if (local_30._M_head_impl != (DataChunk *)0x0) {
    pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&local_30);
    if ((pDVar3->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pDVar3->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&local_30);
      if (pDVar3->count != 0) {
        (this->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult =
             (_func_int **)local_30._M_head_impl;
        local_30._M_head_impl = (DataChunk *)0x0;
        goto LAB_00fd90aa;
      }
    }
  }
  Close(in_RSI);
  (this->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult = (_func_int **)0x0;
LAB_00fd90aa:
  _Var1._M_head_impl = local_30._M_head_impl;
  if (local_30._M_head_impl != (DataChunk *)0x0) {
    DataChunk::~DataChunk(local_30._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> StreamQueryResult::FetchRaw() {
	unique_ptr<DataChunk> chunk;
	{
		auto lock = LockContext();
		CheckExecutableInternal(*lock);
		chunk = FetchInternal(*lock);
	}
	if (!chunk || chunk->ColumnCount() == 0 || chunk->size() == 0) {
		Close();
		return nullptr;
	}
	return chunk;
}